

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O3

void Ivy_ManPrintVerbose(Ivy_Man_t *p,int fHaig)

{
  int iVar1;
  uint *puVar2;
  Ivy_Obj_t *pObj;
  Vec_Ptr_t *pVVar3;
  Vec_Int_t *__ptr;
  char *pcVar4;
  Ivy_Man_t *p_00;
  long lVar5;
  
  printf("PIs: ");
  if (0 < p->vPis->nSize) {
    lVar5 = 0;
    do {
      printf(" %d");
      lVar5 = lVar5 + 1;
    } while (lVar5 < p->vPis->nSize);
  }
  putchar(10);
  printf("POs: ");
  if (0 < p->vPos->nSize) {
    lVar5 = 0;
    do {
      printf(" %d");
      lVar5 = lVar5 + 1;
    } while (lVar5 < p->vPos->nSize);
  }
  putchar(10);
  printf("Latches: ");
  pVVar3 = p->vObjs;
  if (0 < pVVar3->nSize) {
    lVar5 = 0;
    do {
      puVar2 = (uint *)pVVar3->pArray[lVar5];
      if ((puVar2 != (uint *)0x0) && ((puVar2[2] & 0xf) == 4)) {
        pcVar4 = "\'";
        if ((*(ulong *)(puVar2 + 4) & 1) == 0) {
          pcVar4 = " ";
        }
        printf(" %d=%d%s",(ulong)*puVar2,
               (ulong)*(uint *)(*(ulong *)(puVar2 + 4) & 0xfffffffffffffffe),pcVar4);
        pVVar3 = p->vObjs;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < pVVar3->nSize);
  }
  putchar(10);
  p_00 = p;
  __ptr = Ivy_ManDfsSeq(p,(Vec_Int_t **)0x0);
  if (0 < __ptr->nSize) {
    lVar5 = 0;
    do {
      iVar1 = __ptr->pArray[lVar5];
      if (((long)iVar1 < 0) || (p->vObjs->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pObj = (Ivy_Obj_t *)p->vObjs->pArray[iVar1];
      if (pObj == (Ivy_Obj_t *)0x0) break;
      Ivy_ObjPrintVerbose(p_00,pObj,fHaig);
      p_00 = (Ivy_Man_t *)0xa;
      putchar(10);
      lVar5 = lVar5 + 1;
    } while (lVar5 < __ptr->nSize);
  }
  putchar(10);
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return;
}

Assistant:

void Ivy_ManPrintVerbose( Ivy_Man_t * p, int fHaig )
{
    Vec_Int_t * vNodes;
    Ivy_Obj_t * pObj;
    int i;
    printf( "PIs: " );
    Ivy_ManForEachPi( p, pObj, i )
        printf( " %d", pObj->Id );
    printf( "\n" );
    printf( "POs: " );
    Ivy_ManForEachPo( p, pObj, i )
        printf( " %d", pObj->Id );
    printf( "\n" );
    printf( "Latches: " );
    Ivy_ManForEachLatch( p, pObj, i )
        printf( " %d=%d%s", pObj->Id, Ivy_ObjFanin0(pObj)->Id, (Ivy_ObjFaninC0(pObj)? "\'" : " ") );
    printf( "\n" );
    vNodes = Ivy_ManDfsSeq( p, NULL );
    Ivy_ManForEachNodeVec( p, vNodes, pObj, i )
        Ivy_ObjPrintVerbose( p, pObj, fHaig ), printf( "\n" );
    printf( "\n" );
    Vec_IntFree( vNodes );
}